

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  int iVar1;
  SrcList *p;
  short sVar2;
  long lVar3;
  int *piVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  
  bVar10 = 0;
  sVar2 = pSrc->nSrc;
  p = pSrc;
  if ((int)pSrc->nAlloc < sVar2 + nExtra) {
    p = (SrcList *)sqlite3DbRealloc(db,pSrc,(sVar2 + nExtra) * 0x68 + 8);
    if (p == (SrcList *)0x0) {
      return pSrc;
    }
    iVar1 = sqlite3DbMallocSize(db,p);
    p->nAlloc = (short)(((long)iVar1 - 0x70U) / 0x68) + 1;
    sVar2 = p->nSrc;
  }
  lVar7 = (long)sVar2;
  lVar9 = (long)iStart;
  lVar8 = lVar7 * 0x68 + -0x60;
  while (lVar9 < lVar7) {
    lVar7 = lVar7 + -1;
    puVar5 = (undefined8 *)((long)p->a + lVar8 + -8);
    puVar6 = (undefined8 *)((long)p->a + lVar8 + (long)nExtra * 0x68 + -8);
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
    }
    lVar8 = lVar8 + -0x68;
  }
  p->nSrc = p->nSrc + (short)nExtra;
  memset(p->a + lVar9,0,(ulong)(uint)nExtra * 0x68);
  piVar4 = &p->a[lVar9].iCursor;
  for (; lVar9 < nExtra + iStart; lVar9 = lVar9 + 1) {
    *piVar4 = -1;
    piVar4 = piVar4 + 0x1a;
  }
  return p;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = (u16)nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += (i16)nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}